

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::WireType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  local_40 = 0x29;
  local_38 = "com.google.protobuf.WireFormat.FieldType.";
  local_70.piece_ = FieldTypeName((uint)(byte)this[2]);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string WireType(const FieldDescriptor* field) {
  return absl::StrCat("com.google.protobuf.WireFormat.FieldType.",
                      FieldTypeName(field->type()));
}